

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O2

int * inform_black_box(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,int *box,
                      inform_error *err)

{
  void *__dest;
  int iVar1;
  int iVar2;
  long lVar3;
  _Bool _Var4;
  size_t i;
  size_t sVar5;
  int *__ptr;
  void *__dest_00;
  void *__ptr_00;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  size_t j;
  size_t sVar10;
  int *piVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  ulong local_a0;
  int *local_88;
  
  _Var4 = check_arguments(series,l,n,m,b,r,s,err);
  if (!_Var4) {
    if (s == (size_t *)0x0 && r != (size_t *)0x0) {
      local_a0 = 1;
      uVar12 = 0;
      for (sVar5 = 0; l != sVar5; sVar5 = sVar5 + 1) {
        if (local_a0 < r[sVar5]) {
          local_a0 = r[sVar5];
        }
      }
    }
    else {
      local_a0 = 1;
      if (s == (size_t *)0x0 || r != (size_t *)0x0) {
        if (r == (size_t *)0x0 || s == (size_t *)0x0) {
          uVar12 = 0;
        }
        else {
          local_a0 = 1;
          uVar12 = 0;
          for (sVar5 = 0; l != sVar5; sVar5 = sVar5 + 1) {
            if (local_a0 < r[sVar5]) {
              local_a0 = r[sVar5];
            }
            if (uVar12 < s[sVar5]) {
              uVar12 = s[sVar5];
            }
          }
        }
      }
      else {
        uVar12 = 0;
        for (sVar5 = 0; l != sVar5; sVar5 = sVar5 + 1) {
          if (uVar12 < s[sVar5]) {
            uVar12 = s[sVar5];
          }
        }
      }
    }
    __ptr = box;
    if ((box != (int *)0x0) ||
       (__ptr = (int *)calloc(((m - (local_a0 + uVar12)) + 1) * n,4), __ptr != (int *)0x0)) {
      __dest_00 = calloc(l * 2,8);
      if (__dest_00 != (void *)0x0) {
        if (r == (size_t *)0x0) {
          for (sVar5 = 0; l != sVar5; sVar5 = sVar5 + 1) {
            *(undefined8 *)((long)__dest_00 + sVar5 * 8) = 1;
          }
        }
        else {
          memcpy(__dest_00,r,l * 8);
        }
        __dest = (void *)((long)__dest_00 + l * 8);
        if (s != (size_t *)0x0) {
          memcpy(__dest,s,l * 8);
        }
        __ptr_00 = malloc(l * 8);
        if (__ptr_00 == (void *)0x0) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
        }
        else {
          lVar6 = (m - (local_a0 + uVar12)) + 1;
          for (lVar7 = 0; lVar6 * n - lVar7 != 0; lVar7 = lVar7 + 1) {
            __ptr[lVar7] = 0;
          }
          piVar8 = series + local_a0;
          for (sVar5 = 0; sVar5 != l; sVar5 = sVar5 + 1) {
            piVar9 = piVar8;
            piVar11 = series;
            local_88 = __ptr + 1;
            for (sVar10 = 0; sVar10 != n; sVar10 = sVar10 + 1) {
              *(undefined4 *)((long)__ptr_00 + sVar5 * 4) = 1;
              *(undefined4 *)((long)__ptr_00 + sVar5 * 4 + l * 4) = 0;
              lVar7 = *(long *)((long)__dest_00 + sVar5 * 8);
              lVar3 = *(long *)((long)__dest + sVar5 * 8);
              piVar13 = piVar9 + -lVar7;
              iVar15 = 0;
              for (uVar14 = local_a0 - lVar7; uVar14 < lVar3 + local_a0; uVar14 = uVar14 + 1) {
                iVar15 = b[sVar5];
                *(int *)((long)__ptr_00 + sVar5 * 4) = *(int *)((long)__ptr_00 + sVar5 * 4) * iVar15
                ;
                iVar15 = iVar15 * *(int *)((long)__ptr_00 + sVar5 * 4 + l * 4) + *piVar13;
                *(int *)((long)__ptr_00 + sVar5 * 4 + l * 4) = iVar15;
                piVar13 = piVar13 + 1;
              }
              __ptr[sVar10 * lVar6] =
                   __ptr[sVar10 * lVar6] * *(int *)((long)__ptr_00 + sVar5 * 4) + iVar15;
              piVar13 = local_88;
              for (uVar14 = local_a0; uVar14 < m - uVar12; uVar14 = uVar14 + 1) {
                iVar1 = b[sVar5];
                *(int *)((long)__ptr_00 + sVar5 * 4 + l * 4) = iVar15 * iVar1;
                iVar2 = *(int *)((long)__ptr_00 + sVar5 * 4);
                iVar15 = (iVar15 * iVar1 - piVar11[uVar14 - lVar7] * iVar2) +
                         piVar11[lVar3 + uVar14];
                *(int *)((long)__ptr_00 + sVar5 * 4 + l * 4) = iVar15;
                *piVar13 = iVar2 * *piVar13 + iVar15;
                piVar13 = piVar13 + 1;
              }
              piVar9 = piVar9 + m;
              local_88 = local_88 + lVar6;
              piVar11 = piVar11 + m;
            }
            piVar8 = piVar8 + m * n;
            series = series + m * n;
          }
          free(__ptr_00);
        }
        _Var4 = inform_failed(err);
        piVar8 = (int *)0x0;
        if (!_Var4) {
          piVar8 = __ptr;
        }
        if (_Var4 && box == (int *)0x0) {
          free(__ptr);
          piVar8 = (int *)0x0;
        }
        free(__dest_00);
        return piVar8;
      }
      if (box == (int *)0x0) {
        free(__ptr);
      }
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return (int *)0x0;
}

Assistant:

int* inform_black_box(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, int *box, inform_error *err)
{
    if (check_arguments(series, l, n, m, b, r, s, err))
    {
        return NULL;
    }
    size_t max_r, max_s;
    compute_lengths(r, s, l, &max_r, &max_s);

    bool allocate = (box == NULL);
    if (allocate)
    {
        box = calloc(n * (m - max_r - max_s + 1), sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t *data = calloc(2 * l, sizeof(size_t));
    if (data == NULL)
    {
        if (allocate) free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    size_t *history = data;
    if (r == NULL)
    {
        for (size_t i = 0; i < l; ++i) history[i] = 1;
    }
    else
    {
        memcpy(history, r, l * sizeof(size_t));
    }

    size_t *future = data + l;
    if (s != NULL)
    {
        memcpy(future, s, l * sizeof(size_t));
    }

    accumulate(series, l, n, m, b, history, future, max_r, max_s, box, err);

    if (inform_failed(err))
    {
        if (allocate) free(box);
        box = NULL;
    }
    free(data);
    return box;
}